

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaParseSimpleContent
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,
              int *hasRestrictionOrExtension)

{
  xmlSchemaTypePtr annItem;
  int iVar1;
  xmlSchemaAnnotPtr annot;
  xmlAttrPtr local_48;
  xmlAttrPtr attr;
  xmlNodePtr child;
  xmlSchemaTypePtr type;
  int *hasRestrictionOrExtension_local;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if ((((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) ||
      (node == (xmlNodePtr)0x0)) || (hasRestrictionOrExtension == (int *)0x0)) {
    return -1;
  }
  *hasRestrictionOrExtension = 0;
  annItem = ctxt->ctxtType;
  annItem->contentType = XML_SCHEMA_CONTENT_SIMPLE;
  for (local_48 = node->properties; local_48 != (xmlAttrPtr)0x0; local_48 = local_48->next) {
    if (local_48->ns == (xmlNs *)0x0) {
      iVar1 = xmlStrEqual(local_48->name,"id");
      if (iVar1 == 0) {
        xmlSchemaPIllegalAttrErr
                  (ctxt,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,local_48);
      }
    }
    else {
      iVar1 = xmlStrEqual(local_48->ns->href,xmlSchemaNs);
      if (iVar1 != 0) {
        xmlSchemaPIllegalAttrErr
                  (ctxt,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,local_48);
      }
    }
  }
  xmlSchemaPValAttrID(ctxt,node,"id");
  attr = (xmlAttrPtr)node->children;
  if ((((xmlNodePtr)attr != (xmlNodePtr)0x0) && (((xmlNodePtr)attr)->ns != (xmlNs *)0x0)) &&
     ((iVar1 = xmlStrEqual(((xmlNodePtr)attr)->name,(xmlChar *)"annotation"), iVar1 != 0 &&
      (iVar1 = xmlStrEqual(((xmlNodePtr)attr)->ns->href,xmlSchemaNs), iVar1 != 0)))) {
    annot = xmlSchemaParseAnnotation(ctxt,(xmlNodePtr)attr,1);
    xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr)annItem,annot);
    attr = (xmlAttrPtr)((xmlNodePtr)attr)->next;
  }
  if (attr == (xmlAttrPtr)0x0) {
    xmlSchemaPContentErr
              (ctxt,XML_SCHEMAP_S4S_ELEM_MISSING,(xmlSchemaBasicItemPtr)0x0,node,(xmlNodePtr)0x0,
               (char *)0x0,"(annotation?, (restriction | extension))");
    xmlSchemaPContentErr
              (ctxt,XML_SCHEMAP_S4S_ELEM_MISSING,(xmlSchemaBasicItemPtr)0x0,node,(xmlNodePtr)0x0,
               (char *)0x0,"(annotation?, (restriction | extension))");
  }
  else if (((attr->ns != (xmlNs *)0x0) &&
           (iVar1 = xmlStrEqual(attr->name,(xmlChar *)"restriction"), iVar1 != 0)) &&
          (iVar1 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar1 != 0)) {
    xmlSchemaParseRestriction(ctxt,schema,(xmlNodePtr)attr,XML_SCHEMA_TYPE_SIMPLE_CONTENT);
    *hasRestrictionOrExtension = 1;
    attr = attr->next;
    goto LAB_001e25e9;
  }
  if ((((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
      (iVar1 = xmlStrEqual(attr->name,(xmlChar *)"extension"), iVar1 != 0)) &&
     (iVar1 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar1 != 0)) {
    xmlSchemaParseExtension(ctxt,schema,(xmlNodePtr)attr,XML_SCHEMA_TYPE_SIMPLE_CONTENT);
    *hasRestrictionOrExtension = 1;
    attr = attr->next;
  }
LAB_001e25e9:
  if (attr != (xmlAttrPtr)0x0) {
    xmlSchemaPContentErr
              (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,node,
               (xmlNodePtr)attr,(char *)0x0,"(annotation?, (restriction | extension))");
  }
  return 0;
}

Assistant:

static int
xmlSchemaParseSimpleContent(xmlSchemaParserCtxtPtr ctxt,
                            xmlSchemaPtr schema, xmlNodePtr node,
			    int *hasRestrictionOrExtension)
{
    xmlSchemaTypePtr type;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL) ||
	(hasRestrictionOrExtension == NULL))
        return (-1);
    *hasRestrictionOrExtension = 0;
    /* Not a component, don't create it. */
    type = ctxt->ctxtType;
    type->contentType = XML_SCHEMA_CONTENT_SIMPLE;
    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "id"))) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }

    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");

    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
	/*
	* Add the annotation to the complex type ancestor.
	*/
	xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr) type,
	    xmlSchemaParseAnnotation(ctxt, child, 1));
        child = child->next;
    }
    if (child == NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_MISSING,
	    NULL, node, NULL, NULL,
	    "(annotation?, (restriction | extension))");
    }
    if (child == NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_MISSING,
	    NULL, node, NULL, NULL,
	    "(annotation?, (restriction | extension))");
    }
    if (IS_SCHEMA(child, "restriction")) {
        xmlSchemaParseRestriction(ctxt, schema, child,
	    XML_SCHEMA_TYPE_SIMPLE_CONTENT);
	(*hasRestrictionOrExtension) = 1;
        child = child->next;
    } else if (IS_SCHEMA(child, "extension")) {
        xmlSchemaParseExtension(ctxt, schema, child,
	    XML_SCHEMA_TYPE_SIMPLE_CONTENT);
	(*hasRestrictionOrExtension) = 1;
        child = child->next;
    }
    if (child != NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child, NULL,
	    "(annotation?, (restriction | extension))");
    }
    return (0);
}